

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O3

void aom_img_upshift(aom_image_t *dst,aom_image_t *src,int input_shift)

{
  aom_img_fmt_t aVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int offset;
  uchar *puVar15;
  uchar *puVar16;
  
  aVar1 = src->fmt;
  bVar9 = (byte)input_shift;
  uVar8 = ~(ushort)(-1 << (bVar9 - 1 & 0x1f));
  if (input_shift < 1) {
    uVar8 = 0;
  }
  uVar2 = dst->d_w;
  if ((aVar1 >> 0xb & 1) == 0) {
    if (((((uVar2 == src->d_w) && (uVar3 = dst->d_h, uVar3 == src->d_h)) &&
         (uVar4 = dst->x_chroma_shift, uVar4 == src->x_chroma_shift)) &&
        (((uVar5 = dst->y_chroma_shift, uVar5 == src->y_chroma_shift && (-1 < input_shift)) &&
         (dst->fmt == (aVar1 | 0x800))))) &&
       (((aVar1 - AOM_IMG_FMT_I420 < 5 && ((0x19U >> (aVar1 - AOM_IMG_FMT_I420 & 0x1f) & 1) != 0))
        || (aVar1 == AOM_IMG_FMT_YV12)))) {
      lVar11 = 0;
      do {
        uVar12 = uVar5 + uVar3 >> ((byte)uVar5 & 0x1f);
        uVar10 = uVar4 + uVar2 >> ((byte)uVar4 & 0x1f);
        if (lVar11 == 0) {
          uVar12 = uVar3;
          uVar10 = uVar2;
        }
        if (0 < (int)uVar12) {
          puVar16 = src->planes[lVar11];
          iVar6 = src->stride[lVar11];
          puVar15 = dst->planes[lVar11];
          iVar7 = dst->stride[lVar11];
          uVar13 = 0;
          do {
            if (0 < (int)uVar10) {
              lVar14 = 0;
              do {
                *(ushort *)(puVar15 + lVar14 * 2) =
                     ((ushort)puVar16[lVar14] << (bVar9 & 0x1f)) + uVar8;
                lVar14 = lVar14 + 1;
              } while (uVar10 != (uint)lVar14);
            }
            uVar13 = uVar13 + 1;
            puVar15 = puVar15 + iVar7;
            puVar16 = puVar16 + iVar6;
          } while (uVar13 != uVar12);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      return;
    }
  }
  else if (((((uVar2 == src->d_w) && (uVar3 = dst->d_h, uVar3 == src->d_h)) &&
            (uVar4 = dst->x_chroma_shift, uVar4 == src->x_chroma_shift)) &&
           ((uVar5 = dst->y_chroma_shift, uVar5 == src->y_chroma_shift && (-1 < input_shift)))) &&
          ((dst->fmt == aVar1 && ((aVar1 - AOM_IMG_FMT_I42216 < 2 || (aVar1 == AOM_IMG_FMT_I42016)))
           ))) {
    lVar11 = 0;
    do {
      uVar12 = uVar5 + uVar3 >> ((byte)uVar5 & 0x1f);
      uVar10 = uVar4 + uVar2 >> ((byte)uVar4 & 0x1f);
      if (lVar11 == 0) {
        uVar12 = uVar3;
        uVar10 = uVar2;
      }
      if (0 < (int)uVar12) {
        puVar16 = src->planes[lVar11];
        iVar6 = src->stride[lVar11];
        puVar15 = dst->planes[lVar11];
        iVar7 = dst->stride[lVar11];
        uVar13 = 0;
        do {
          if (0 < (int)uVar10) {
            lVar14 = 0;
            do {
              *(ushort *)(puVar15 + lVar14 * 2) =
                   (*(short *)(puVar16 + lVar14 * 2) << (bVar9 & 0x1f)) + uVar8;
              lVar14 = lVar14 + 1;
            } while (uVar10 != (uint)lVar14);
          }
          uVar13 = uVar13 + 1;
          puVar15 = puVar15 + iVar7;
          puVar16 = puVar16 + iVar6;
        } while (uVar13 != uVar12);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    return;
  }
  fatal("Unsupported image conversion");
}

Assistant:

void aom_img_upshift(aom_image_t *dst, const aom_image_t *src,
                     int input_shift) {
  if (src->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_upshift(dst, src, input_shift);
  } else {
    lowbd_img_upshift(dst, src, input_shift);
  }
}